

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O2

int doloot(void)

{
  bool bVar1;
  bool bVar2;
  boolean bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  obj *poVar8;
  permonst *ptr;
  monst *pmVar9;
  obj *unaff_RBX;
  xchar xVar10;
  long lVar11;
  int i;
  void *__ptr;
  char *line;
  int iVar12;
  obj **obj;
  uint uVar13;
  int iVar14;
  char *pcVar15;
  xchar xVar16;
  coord cc;
  boolean prev_loot;
  int local_48;
  int prev_inquiry;
  object_pick *lootlist;
  d_level *local_38;
  
  prev_inquiry = 0;
  prev_loot = '\0';
  uVar13 = 0;
  bVar3 = check_capacity((char *)0x0);
  if (bVar3 == '\0') {
    if (((youmonst.data)->mflags1 & 0x2000) == 0) {
      cc.x = u.ux;
      cc.y = u.uy;
      local_38 = &u.uz;
      uVar13 = 0;
      local_48 = -1;
      xVar16 = u.uy;
      xVar10 = u.ux;
LAB_00205d4e:
      iVar12 = (int)xVar10;
      iVar14 = (int)xVar16;
      iVar4 = container_at(iVar12,iVar14,'\x01');
      if (iVar4 == 0) {
        iVar4 = local_48;
        if (u.uprops[0x1c].intrinsic == 0) {
          if (level->locations[iVar12][iVar14].typ == ' ') {
            pline("You need to dig up the grave to effectively loot it...");
            iVar4 = local_48;
          }
        }
        else {
          obj = &invent;
          do {
            obj = &((obj *)obj)->nobj->nobj;
            if ((obj *)obj == (obj *)0x0) goto LAB_00206098;
          } while (((obj *)obj)->oclass != '\f');
          iVar4 = ((obj *)obj)->quan;
          if (0x7ffe < iVar4) {
            iVar4 = 0x7fff;
          }
          uVar13 = rnd(iVar4);
          if ((int)uVar13 < ((obj *)obj)->quan) {
            obj = &splitobj((obj *)obj,(ulong)uVar13)->nobj;
          }
          freeinv((obj *)obj);
          if (level->locations[u.ux][u.uy].typ == '\x1d') {
            for (iVar4 = 2; poVar8 = (obj *)&level->objlist, -1 < iVar4; iVar4 = iVar4 + -2) {
              while (unaff_RBX = poVar8->nobj, unaff_RBX != (obj *)0x0) {
                poVar8 = unaff_RBX;
                if (((ushort)(unaff_RBX->otyp - 0xdbU) < 2) && (iVar4 == unaff_RBX->spe))
                goto LAB_00206065;
              }
              unaff_RBX = (obj *)0x0;
            }
            if (unaff_RBX == (obj *)0x0) {
              ptr = courtmon(local_38);
              pmVar9 = makemon(ptr,level,(int)u.ux,(int)u.uy,0);
              if (pmVar9 == (monst *)0x0) {
                dropy((obj *)obj);
              }
              else {
                add_to_minv(pmVar9,(obj *)obj);
                pline("The exchequer accepts your contribution.");
                uVar13 = mt_random();
                if (uVar13 % 0x32 == 0) {
                  level->locations[u.ux][u.uy].typ = '\x19';
                  pline("The throne vanishes in a puff of logic.");
                  newsym((int)u.ux,(int)u.uy);
                }
              }
              uVar13 = 1;
              unaff_RBX = (obj *)0x0;
              iVar4 = local_48;
              goto LAB_00206098;
            }
LAB_00206065:
            verbalize("Thank you for your contribution to reduce the debt.");
            add_to_container(unaff_RBX,(obj *)obj);
            uVar13 = weight(unaff_RBX);
            unaff_RBX->owt = uVar13;
          }
          else {
            dropy((obj *)obj);
            pline("Ok, now there is loot here.");
          }
          uVar13 = 1;
          iVar4 = local_48;
        }
      }
      else {
        bVar3 = able_to_loot(iVar12,iVar14,"loot");
        if (bVar3 == '\0') {
          return 0;
        }
        uVar5 = query_objlist("Loot which containers?",level->objects[cc.x][cc.y],
                              (uint)(level->locations[cc.x][cc.y].typ == '\x1e') * 0x80 +
                              (uint)(iflags.paranoid_loot == '\0') * 2 + 0x21,&lootlist,2,
                              Is_container_func);
        if ((int)uVar5 < 0) {
          return 0;
        }
        if (uVar5 == 0) {
          iVar4 = 0x6e;
        }
        else {
          __ptr = (void *)CONCAT71(lootlist._1_7_,(char)lootlist);
          for (lVar11 = 0; (ulong)uVar5 << 4 != lVar11; lVar11 = lVar11 + 0x10) {
            poVar8 = *(obj **)((long)__ptr + lVar11);
            if (poVar8 == &zeroobj) {
              pline("You carefully open the magic chest...");
LAB_00205e85:
              uVar6 = use_container(poVar8,0);
              if (multi < 0) {
LAB_00206257:
                free(__ptr);
                return 1;
              }
              uVar13 = uVar13 | uVar6;
            }
            else {
              if ((poVar8->field_0x4b & 0x20) == 0) {
                if ((poVar8->otyp == 0xe1) && ('\0' < poVar8->spe)) {
                  pline("You carefully open the bag...");
                  pcVar7 = "teeth and bites";
                  if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
                    if (u.umonnum == u.umonster) {
                      pcVar7 = "lips and kisses";
                    }
                    else {
                      bVar3 = dmgtype(youmonst.data,0x24);
                      pcVar7 = "teeth and bites";
                      if (bVar3 == '\0') {
                        pcVar7 = "lips and kisses";
                      }
                    }
                  }
                  pline("It develops a huge set of %s you!",pcVar7);
                  uVar5 = rnd(10);
                  uVar13 = uVar5 + 1 >> 1;
                  if (u.uprops[0x33].extrinsic == 0 && u.uprops[0x33].intrinsic == 0) {
                    uVar13 = uVar5;
                  }
                  pcVar7 = "carnivorous bag";
                  if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
                    if (u.umonnum == u.umonster) {
                      pcVar7 = "amorous bag";
                    }
                    else {
                      bVar3 = dmgtype(youmonst.data,0x24);
                      pcVar7 = "carnivorous bag";
                      if (bVar3 == '\0') {
                        pcVar7 = "amorous bag";
                      }
                    }
                  }
                  losehp(uVar13,pcVar7,0);
                  discover_object(0xe1,'\x01','\x01');
                  free(__ptr);
                  return 1;
                }
                pcVar7 = xname(poVar8);
                the(pcVar7);
                pline("You carefully open %s...");
                goto LAB_00205e85;
              }
              pline("Hmmm, it seems to be locked.");
              if (flags.autounlock != '\0') {
                iVar4 = 0xf2;
                if (poVar8->otyp == 0xdc) {
LAB_00205ed4:
                  poVar8 = carrying(iVar4);
                  if (poVar8 == (obj *)0x0) goto LAB_00205ea2;
                }
                else {
                  poVar8 = carrying(0xe2);
                  if ((poVar8 == (obj *)0x0) && (poVar8 = carrying(0xe3), poVar8 == (obj *)0x0)) {
                    iVar4 = 0xe4;
                    goto LAB_00205ed4;
                  }
                }
                iVar4 = pick_lock(poVar8,(int)cc.x,(int)cc.y,'\x01','\x01');
                if (iVar4 != 0) {
                  __ptr = (void *)CONCAT71(lootlist._1_7_,(char)lootlist);
                  goto LAB_00206257;
                }
              }
            }
LAB_00205ea2:
          }
          free(__ptr);
          iVar4 = 0x79;
        }
      }
LAB_00206098:
      if (iVar4 == 0x79) {
        return uVar13;
      }
      iVar12 = -1;
      do {
        if (iVar12 == 2) {
          if (iVar4 == 0x6e) {
            return uVar13;
          }
          if (iVar4 == 0x79) {
            return uVar13;
          }
          line = "You %s %s to loot.";
          pcVar15 = "don\'t find anything";
          pcVar7 = "here";
LAB_00206296:
          pline(line,pcVar15,pcVar7);
          return uVar13;
        }
        for (iVar14 = -1; iVar14 != 2; iVar14 = iVar14 + 1) {
          if ((((uint)(u.uy + iVar14) < 0x15 && (iVar12 + u.ux) - 1U < 0x4f) &&
              (pmVar9 = level->monsters[(uint)(iVar12 + u.ux)][(uint)(u.uy + iVar14)],
              pmVar9 != (monst *)0x0)) && ((pmVar9->field_0x61 & 2) == 0)) {
            iVar12 = get_adjacent_loc("Loot in what direction?","Invalid loot location",u.ux,u.uy,
                                      &cc,(schar *)&lootlist);
            xVar16 = cc.y;
            xVar10 = cc.x;
            if (iVar12 == 0) {
              return uVar13;
            }
            iVar12 = (int)cc.x;
            bVar1 = true;
            local_48 = iVar4;
            if ((cc.x == u.ux) && (cc.y == u.uy)) {
              bVar1 = false;
              iVar4 = container_at(iVar12,(int)cc.y,'\0');
              if (iVar4 != 0) goto LAB_00205d4e;
            }
            if ((char)lootlist < '\0') {
              pcVar7 = ceiling(iVar12,(int)cc.y);
              pline("You %s to loot on the %s.","don\'t find anything",pcVar7);
              return 1;
            }
            pmVar9 = level->monsters[xVar10][cc.y];
            bVar2 = true;
            if ((pmVar9 == (monst *)0x0) || ((pmVar9->field_0x61 & 2) != 0)) {
              pmVar9 = (monst *)0x0;
            }
            else {
              uVar13 = loot_mon(pmVar9,&prev_inquiry,&prev_loot);
              bVar2 = false;
            }
            if (!bVar1) {
              return uVar13;
            }
            iVar4 = container_at((int)cc.x,(int)cc.y,'\0');
            if (iVar4 == 0) {
              pcVar7 = "";
              if (prev_loot != '\0') {
                pcVar7 = "else ";
              }
              if (prev_inquiry != 0) {
                pcVar7 = "else ";
              }
              line = "You %s %sthere to loot.";
              pcVar15 = "don\'t find anything";
            }
            else {
              if (bVar2) {
                pcVar7 = "You have to be at a container to loot it.";
                goto LAB_0020624b;
              }
              pcVar15 = "else ";
              if (prev_inquiry == 0) {
                pcVar15 = "";
              }
              pcVar7 = mon_nam(pmVar9);
              line = "You can\'t loot anything %sthere with %s in the way.";
            }
            goto LAB_00206296;
          }
        }
        iVar12 = iVar12 + 1;
      } while( true );
    }
    pcVar7 = "You have no hands!";
    uVar13 = 0;
LAB_0020624b:
    pline(pcVar7);
  }
  return uVar13;
}

Assistant:

int doloot(void)
{
    struct obj *cobj, *pobj;
    int c = -1;
    int timepassed = 0;
    coord cc;
    boolean underfoot = TRUE;
    const char *dont_find_anything = "don't find anything";
    struct monst *mtmp;
    int prev_inquiry = 0;
    boolean prev_loot = FALSE;
    int container_count = 0;

    if (check_capacity(NULL)) {
	/* "Can't do that while carrying so much stuff." */
	return 0;
    }
    if (nohands(youmonst.data)) {
	pline("You have no hands!");	/* not `body_part(HAND)' */
	return 0;
    }
    cc.x = u.ux; cc.y = u.uy;

lootcont:

    if ((container_count = container_at(cc.x, cc.y, TRUE))) {
	struct object_pick *lootlist;
	int i, n;
	int qflags;

	if (!able_to_loot(cc.x, cc.y, "loot")) return 0;

	qflags = BY_NEXTHERE|SIGNAL_ESCAPE;
	if (!iflags.paranoid_loot)
	    qflags |= AUTOSELECT_SINGLE;
	if (IS_MAGIC_CHEST(level->locations[cc.x][cc.y].typ))
	    qflags |= SHOW_MAGIC_CHEST;
	n = query_objlist("Loot which containers?", level->objects[cc.x][cc.y],
			  qflags, &lootlist, PICK_ANY, Is_container_func);

	if (n < 0) {
	    return 0;
	} else if (n == 0) {
	    c = 'n';
	} else if (n > 0) {
	    c = 'y';
	    for (i = 0; i < n; i++) {
		cobj = lootlist[i].obj;
		if (!cobj_is_magic_chest(cobj) && cobj->olocked) {
		    pline("Hmmm, it seems to be locked.");
		    if (flags.autounlock) {
			pobj = NULL;
			if (cobj->otyp == IRON_SAFE) {
			    pobj = carrying(STETHOSCOPE);
			} else {
			    pobj = carrying(SKELETON_KEY);
			    if (!pobj) pobj = carrying(LOCK_PICK);
			    if (!pobj) pobj = carrying(CREDIT_CARD);
			}
			if (pobj) {
			    if (pick_lock(pobj, cc.x, cc.y, TRUE, TRUE)) {
				/* Non-zero return technically only means it
				 * took time, but it also conveniently means
				 * that unlocking is beginning to take place,
				 * so duck out of this container loop in that
				 * case. */
				free(lootlist);
				return 1;
			    }
			}
		    }
		    continue;
		}
		if (!cobj_is_magic_chest(cobj) &&
			cobj->otyp == BAG_OF_TRICKS && cobj->spe > 0) {
		    int tmp;
		    pline("You carefully open the bag...");
		    pline("It develops a huge set of %s you!",
			  Hallucination ? "lips and kisses" : "teeth and bites");
		    tmp = rnd(10);
		    if (Half_physical_damage) tmp = (tmp+1) / 2;
		    losehp(tmp, Hallucination ? "amorous bag" : "carnivorous bag",
			   KILLED_BY_AN);
		    makeknown(BAG_OF_TRICKS);
		    free(lootlist);
		    return 1;
		}

		if (cobj_is_magic_chest(cobj))
		    pline("You carefully open the magic chest...");
		else
		    pline("You carefully open %s...", the(xname(cobj)));
		timepassed |= use_container(cobj, 0);
		if (multi < 0) {
		    /* container trap or BoHsplosion */
		    free(lootlist);
		    return 1;
		}
	    }
	    free(lootlist);
	}
    } else if (Confusion) {
	struct obj *goldob;
	/* Find a money object to mess with */
	for (goldob = invent; goldob; goldob = goldob->nobj) {
	    if (goldob->oclass == COIN_CLASS) break;
	}
	if (goldob){
	    long contribution = rnd((int)min(LARGEST_INT, goldob->quan));
	    if (contribution < goldob->quan)
		goldob = splitobj(goldob, contribution);
	    freeinv(goldob);

	    if (IS_THRONE(level->locations[u.ux][u.uy].typ)){
		struct obj *coffers;
		int pass;
		/* find the original coffers chest, or any chest */
		for (pass = 2; pass > -1; pass -= 2)
		    for (coffers = level->objlist; coffers; coffers = coffers->nobj)
			if ((coffers->otyp == CHEST || coffers->otyp == IRON_SAFE) && coffers->spe == pass)
			    goto gotit;	/* two level break */
gotit:
		if (coffers) {
	    verbalize("Thank you for your contribution to reduce the debt.");
		    add_to_container(coffers, goldob);
		    coffers->owt = weight(coffers);
		} else {
		    struct monst *mon = makemon(courtmon(&u.uz), level,
					    u.ux, u.uy, NO_MM_FLAGS);
		    if (mon) {
			add_to_minv(mon, goldob);
			pline("The exchequer accepts your contribution.");
			if (!rn2(50)) {
			    level->locations[u.ux][u.uy].typ = ROOM;
			    pline("The throne vanishes in a puff of logic.");
			    newsym(u.ux,u.uy);
			}
		    } else {
			dropy(goldob);
		    }
		}
	    } else {
		dropy(goldob);
		pline("Ok, now there is loot here.");
	    }
	    timepassed = 1;
	}
    } else if (IS_GRAVE(level->locations[cc.x][cc.y].typ)) {
	pline("You need to dig up the grave to effectively loot it...");
    }
    /*
     * 3.3.1 introduced directional looting for some things.
     */
    if (c != 'y' && mon_beside(u.ux, u.uy)) {
	schar dz;
	if (!get_adjacent_loc("Loot in what direction?", "Invalid loot location",
			u.ux, u.uy, &cc, &dz))
	    return timepassed;
	if (cc.x == u.ux && cc.y == u.uy) {
	    underfoot = TRUE;
	    if (container_at(cc.x, cc.y, FALSE))
		goto lootcont;
	} else
	    underfoot = FALSE;
	if (dz < 0) {
	    pline("You %s to loot on the %s.", dont_find_anything,
		ceiling(cc.x, cc.y));
	    timepassed = 1;
	    return timepassed;
	}
	mtmp = m_at(level, cc.x, cc.y);
	if (mtmp) timepassed = loot_mon(mtmp, &prev_inquiry, &prev_loot);

	/* Preserve pre-3.3.1 behaviour for containers.
	 * Adjust this if-block to allow container looting
	 * from one square away to change that in the future.
	 */
	if (!underfoot) {
	    if (container_at(cc.x, cc.y, FALSE)) {
		if (mtmp) {
		    pline("You can't loot anything %sthere with %s in the way.",
			    prev_inquiry ? "else " : "", mon_nam(mtmp));
		    return timepassed;
		} else {
		    pline("You have to be at a container to loot it.");
		}
	    } else {
		pline("You %s %sthere to loot.", dont_find_anything,
			(prev_inquiry || prev_loot) ? "else " : "");
		return timepassed;
	    }
	}
    } else if (c != 'y' && c != 'n') {
	pline("You %s %s to loot.", dont_find_anything,
		    underfoot ? "here" : "there");
    }
    return timepassed;
}